

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_sort.cpp
# Opt level: O3

OrderType duckdb::GetOrder<duckdb::OrderType>(ClientContext *context,Expression *expr)

{
  char cVar1;
  OrderType OVar2;
  InvalidInputException *this;
  string order_name;
  Value order_value;
  undefined1 *local_a0;
  undefined1 local_90 [16];
  char *local_80 [2];
  char local_70 [16];
  undefined1 *local_60 [2];
  undefined1 local_50 [48];
  
  cVar1 = (**(code **)(*(long *)expr + 0x78))(expr);
  if (cVar1 != '\0') {
    duckdb::ExpressionExecutor::EvaluateScalar
              ((ClientContext *)local_60,(Expression *)context,SUB81(expr,0));
    duckdb::Value::ToString_abi_cxx11_();
    duckdb::StringUtil::Upper((string *)local_80);
    if (local_a0 != local_90) {
      operator_delete(local_a0);
    }
    OVar2 = duckdb::EnumUtil::FromString<duckdb::OrderType>(local_80[0]);
    if (local_80[0] != local_70) {
      operator_delete(local_80[0]);
    }
    duckdb::Value::~Value((Value *)local_60);
    return OVar2;
  }
  this = (InvalidInputException *)__cxa_allocate_exception(0x10);
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_60,"Sorting order must be a constant","");
  duckdb::InvalidInputException::InvalidInputException(this,(string *)local_60);
  __cxa_throw(this,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static T GetOrder(ClientContext &context, Expression &expr) {
	if (!expr.IsFoldable()) {
		throw InvalidInputException("Sorting order must be a constant");
	}
	Value order_value = ExpressionExecutor::EvaluateScalar(context, expr);
	auto order_name = StringUtil::Upper(order_value.ToString());
	return EnumUtil::FromString<T>(order_name.c_str());
}